

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

int prvTidyHTMLVersion(TidyDocImpl *doc)

{
  uint uVar1;
  Lexer *pLVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  pLVar2 = doc->lexer;
  uVar7 = pLVar2->doctype;
  uVar1 = *(uint *)((doc->config).value + 0xe);
  if ((*(int *)((doc->config).value + 100) == 0) && (pLVar2->isvoyager == no)) {
    bVar9 = false;
  }
  else {
    bVar9 = *(int *)((doc->config).value + 0x21) == 0;
  }
  bVar8 = 1 < uVar1 - 3;
  bVar10 = (uVar7 & 0x1ffc) == 0;
  iVar3 = (uint)bVar9 * 0x20000 + 0x20000;
  if (((uVar7 == 0) || (iVar3 = 0x20000, (uVar7 != 0x60000 | bVar9) != 1)) ||
     (((((bVar10 && bVar8) && (uVar1 & 0xfffffffd) == 0) & bVar9) == 1 &&
      (iVar3 = 0x40000, (pLVar2->versions & 0x60000) == 0x40000)))) {
    return iVar3;
  }
  uVar4 = 0;
  puVar6 = &W3C_Doctypes[0].vers;
  uVar5 = 0;
  uVar7 = 0;
  do {
    if (((bVar9 == false) || ((*puVar6 & 0x41f00) != 0)) &&
       (((bVar10 && bVar8 || ((*puVar6 & 0x1ffc) != 0)) &&
        (((*puVar6 & pLVar2->versions) != 0 && (((_doctypes *)(puVar6 + -1))->score <= uVar7 - 1))))
       )) {
      uVar5 = uVar4 & 0xffffffff;
      uVar7 = ((_doctypes *)(puVar6 + -1))->score;
    }
    uVar4 = uVar4 + 1;
    puVar6 = puVar6 + 10;
  } while (uVar4 != 0x13);
  if (uVar7 != 0) {
    return W3C_Doctypes[uVar5].vers;
  }
  return 0;
}

Assistant:

int TY_(HTMLVersion)(TidyDocImpl* doc)
{
    uint i;
    uint j = 0;
    uint score = 0;
    uint vers = doc->lexer->versions;
    uint dtver = doc->lexer->doctype;
    TidyDoctypeModes dtmode = (TidyDoctypeModes)cfg(doc, TidyDoctypeMode);
    Bool xhtml = (cfgBool(doc, TidyXmlOut) || doc->lexer->isvoyager) &&
                 !cfgBool(doc, TidyHtmlOut);
    Bool html4 = ((dtmode == TidyDoctypeStrict) || (dtmode == TidyDoctypeLoose) ||
                  (VERS_HMTL40PX & dtver) ? yes : no);
    Bool html5 = (!html4 && ((dtmode == TidyDoctypeAuto) ||
                  (dtmode == TidyDoctypeHtml5)) ? yes : no);

    if (xhtml && dtver == VERS_UNKNOWN) return XH50;
    if (dtver == VERS_UNKNOWN) return HT50;
    /* Issue #167 - if NOT XHTML, and doctype is default VERS_HTML5, then return HT50 */
    if (!xhtml && (dtver == VERS_HTML5)) return HT50;
    /* Issue #377 - If xhtml and (doctype == html5) and constrained vers contains XH50 return that,
       and really if tidy defaults to 'html5', then maybe 'auto' should also apply! */
    if (xhtml && html5 && ((vers & VERS_HTML5) == XH50)) return XH50;

    for (i = 0; W3C_Doctypes[i].name; ++i)
    {
        if ((xhtml && !(VERS_XHTML & W3C_Doctypes[i].vers)) ||
            (html4 && !(VERS_HMTL40PX & W3C_Doctypes[i].vers)))
            continue;

        if (vers & W3C_Doctypes[i].vers &&
            (W3C_Doctypes[i].score < score || !score))
        {
            score = W3C_Doctypes[i].score;
            j = i;
        }
    }

    if (score)
        return W3C_Doctypes[j].vers;

    return VERS_UNKNOWN;
}